

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec2i __thiscall embree::XMLLoader::load<embree::Vec2<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  int iVar1;
  int iVar2;
  runtime_error *this_01;
  long *in_RDX;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0x90) {
    iVar1 = Token::Int(this_00);
    iVar2 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x48));
    *(int *)&(this->path).filename._M_dataplus._M_p = iVar1;
    *(int *)((long)&(this->path).filename._M_dataplus._M_p + 4) = iVar2;
    return (Vec2i)(anon_union_8_2_4062524c_for_Vec2<int>_1)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&sStack_58,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_38,&sStack_58,": wrong int2 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec2i XMLLoader::load<Vec2i>(const Ref<XML>& xml) {
    if (xml->body.size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int2 body");
    return Vec2i(xml->body[0].Int(),xml->body[1].Int());
  }